

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls_sim.c
# Opt level: O3

int IDAGetNonlinearSystemDataSens
              (void *ida_mem,sunrealtype *tcur,N_Vector **yySpred,N_Vector **ypSpred,N_Vector **yySn
              ,N_Vector **ypSn,sunrealtype *cj,void **user_data)

{
  int iVar1;
  
  if (ida_mem == (void *)0x0) {
    iVar1 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0xd6,"IDAGetNonlinearSystemDataSens",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    *tcur = *(sunrealtype *)((long)ida_mem + 0x4f8);
    *yySpred = *(N_Vector **)((long)ida_mem + 0x3a0);
    *ypSpred = *(N_Vector **)((long)ida_mem + 0x3a8);
    *yySn = *(N_Vector **)((long)ida_mem + 0x390);
    *ypSn = *(N_Vector **)((long)ida_mem + 0x398);
    *cj = *(sunrealtype *)((long)ida_mem + 0x508);
    *user_data = *(void **)((long)ida_mem + 0x18);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDAGetNonlinearSystemDataSens(void* ida_mem, sunrealtype* tcur,
                                  N_Vector** yySpred, N_Vector** ypSpred,
                                  N_Vector** yySn, N_Vector** ypSn,
                                  sunrealtype* cj, void** user_data)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  *tcur      = IDA_mem->ida_tn;
  *yySpred   = IDA_mem->ida_yySpredict;
  *ypSpred   = IDA_mem->ida_ypSpredict;
  *yySn      = IDA_mem->ida_yyS;
  *ypSn      = IDA_mem->ida_ypS;
  *cj        = IDA_mem->ida_cj;
  *user_data = IDA_mem->ida_user_data;

  return (IDA_SUCCESS);
}